

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O0

char * icetGetStrategyName(void)

{
  IceTEnum local_14;
  char *pcStack_10;
  IceTEnum strategy;
  
  icetGetEnumv(0x24,&local_14);
  if (local_14 == 0xffffffff) {
    icetRaiseDiagnostic("No strategy set. Use icetStrategy to set the strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x36);
    pcStack_10 = (char *)0x0;
  }
  else {
    pcStack_10 = icetStrategyNameFromEnum(local_14);
  }
  return pcStack_10;
}

Assistant:

const char *icetGetStrategyName(void)
{
    IceTEnum strategy;

    icetGetEnumv(ICET_STRATEGY, &strategy);
    if (strategy != ICET_STRATEGY_UNDEFINED) {
        return icetStrategyNameFromEnum(strategy);
    } else {
        icetRaiseError("No strategy set. Use icetStrategy to set the strategy.",
                       ICET_INVALID_ENUM);
        return NULL;
    }
}